

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O3

void __thiscall
ArgumentParser::Instance::Consume
          (Instance *this,string_view arg,void *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *unparsedArguments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywordsMissingValue)

{
  ActionMap *this_00;
  string *this_01;
  pointer pbVar1;
  pointer pcVar2;
  const_iterator cVar3;
  char *pcVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_02;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string **local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar4 = arg._M_str;
  this_00 = this->Bindings;
  local_68._M_len = arg._M_len;
  local_68._M_str = pcVar4;
  cVar3 = ActionMap::Find(this_00,arg);
  if (cVar3._M_current ==
      (this_00->
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ).
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = this->CurrentString;
    if (this_01 == (string *)0x0) {
      this_02 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                this->CurrentList;
      if ((this_02 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) ||
         (this_02 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    unparsedArguments,
         unparsedArguments !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(this_02,&local_68);
      }
    }
    else {
      local_58 = &this->CurrentString;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar4,pcVar4 + arg._M_len)
      ;
      std::__cxx11::string::operator=((string *)this_01,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      *local_58 = (string *)0x0;
      local_58[1] = (string *)0x0;
    }
    if (this->ExpectValue == true) {
      if (keywordsMissingValue !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        pbVar1 = (keywordsMissingValue->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (keywordsMissingValue->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
        pcVar2 = pbVar1[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &pbVar1[-1].field_2) {
          operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
        }
      }
      this->ExpectValue = false;
    }
  }
  else {
    local_50[0] = (long *)result;
    if (((cVar3._M_current)->second).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*((cVar3._M_current)->second)._M_invoker)
              ((_Any_data *)&(cVar3._M_current)->second,this,local_50);
    if ((keywordsMissingValue !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0) && (this->ExpectValue != false)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 keywordsMissingValue,&local_68);
    }
  }
  return;
}

Assistant:

void Instance::Consume(cm::string_view arg, void* result,
                       std::vector<std::string>* unparsedArguments,
                       std::vector<std::string>* keywordsMissingValue)
{
  auto const it = this->Bindings.Find(arg);
  if (it != this->Bindings.end()) {
    it->second(*this, result);
    if (this->ExpectValue && keywordsMissingValue != nullptr) {
      keywordsMissingValue->emplace_back(arg);
    }
    return;
  }

  if (this->CurrentString != nullptr) {
    this->CurrentString->assign(std::string(arg));
    this->CurrentString = nullptr;
    this->CurrentList = nullptr;
  } else if (this->CurrentList != nullptr) {
    this->CurrentList->emplace_back(arg);
  } else if (unparsedArguments != nullptr) {
    unparsedArguments->emplace_back(arg);
  }

  if (this->ExpectValue) {
    if (keywordsMissingValue != nullptr) {
      keywordsMissingValue->pop_back();
    }
    this->ExpectValue = false;
  }
}